

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O3

void Sfm_LibCellProfile(Mio_Cell2_t *pCellBot,Mio_Cell2_t *pCellTop,int InTop,int nFanins,int *Perm,
                       int *pProf)

{
  ulong uVar1;
  int iVar2;
  
  if (0 < nFanins) {
    uVar1 = 0;
    do {
      iVar2 = 1;
      if (Perm[uVar1] < (int)(*(uint *)&pCellBot->field_0x10 >> 0x1c)) {
        iVar2 = 2 - (uint)(pCellTop == (Mio_Cell2_t *)0x0);
      }
      pProf[uVar1] = iVar2;
      uVar1 = uVar1 + 1;
    } while ((uint)nFanins != uVar1);
  }
  return;
}

Assistant:

void Sfm_LibCellProfile( Mio_Cell2_t * pCellBot, Mio_Cell2_t * pCellTop, int InTop, int nFanins, int * Perm, int * pProf )
{
    int i, DelayAdd = pCellTop ? 1 : 0;
    for ( i = 0; i < nFanins; i++ )
        if ( Perm[i] < (int)pCellBot->nFanins )
            pProf[i] = 1 + DelayAdd;
        else if ( Perm[i] < (int)pCellBot->nFanins + InTop )
            pProf[i] = 1;
        else // if ( Perm[i] >= (int)pCellBot->nFanins + InTop )
            pProf[i] = 1;
}